

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::CommandTask::provideValue
          (CommandTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,ValueType *valueData)

{
  Command *pCVar1;
  ValueType *pVVar2;
  KeyType *pKVar3;
  BuildSystemImpl *this_00;
  BuildSystem *pBVar4;
  TaskInterface ti_00;
  BuildValue local_c8;
  CommandTask *local_58;
  void *local_50;
  CommandTask *local_48;
  void *local_40;
  ValueType *local_38;
  ValueType *valueData_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  CommandTask *this_local;
  TaskInterface ti_local;
  
  ti_00.ctx = ti.ctx;
  local_48 = (CommandTask *)ti.impl;
  pCVar1 = this->command;
  ti_00.impl = ti_00.ctx;
  local_40 = ti_00.ctx;
  local_38 = valueData;
  valueData_local = (ValueType *)key;
  key_local = (KeyType *)inputID;
  inputID_local = (uintptr_t)this;
  this_local = local_48;
  ti_local.impl = ti_00.ctx;
  this_00 = getBuildSystem((anon_unknown_dwarf_ecf33 *)local_48,ti_00);
  pBVar4 = BuildSystemImpl::getBuildSystem(this_00);
  pKVar3 = key_local;
  pVVar2 = valueData_local;
  local_58 = this_local;
  local_50 = ti_local.impl;
  llbuild::buildsystem::BuildValue::fromData(&local_c8,local_38);
  (*(pCVar1->super_JobDescriptor)._vptr_JobDescriptor[0x11])
            (pCVar1,pBVar4,local_58,local_50,pKVar3,pVVar2,&local_c8);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_c8);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    command.provideValue(getBuildSystem(ti).getBuildSystem(), ti, inputID,
                         key, BuildValue::fromData(valueData));
  }